

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue_generic_tests.cpp
# Opt level: O1

void density_tests::heter_queue_generic_tests
               (QueueTesterFlags i_flags,ostream *i_output,EasyRandom *i_rand,size_t i_element_count
               )

{
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  allocator_type local_a1;
  unsigned_long local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  if ((i_flags & eUseTestAllocators) == eNone) {
    local_a0 = 1;
    __l._M_len = 1;
    __l._M_array = &local_a0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_98,__l,&local_a1);
    detail::
    single_queue_generic_test<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>
              (i_flags,i_output,i_rand,i_element_count,&local_98);
  }
  else {
    local_a0 = 1;
    __l_00._M_len = 1;
    __l_00._M_array = &local_a0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_38,__l_00,&local_a1);
    detail::
    single_queue_generic_test<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>>
              (i_flags,i_output,i_rand,i_element_count,&local_38);
    if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    local_a0 = 1;
    __l_01._M_len = 1;
    __l_01._M_array = &local_a0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_50,__l_01,&local_a1);
    detail::
    single_queue_generic_test<density::heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>>>
              (i_flags,i_output,i_rand,i_element_count,&local_50);
    if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    local_a0 = 1;
    __l_02._M_len = 1;
    __l_02._M_array = &local_a0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_68,__l_02,&local_a1);
    detail::
    single_queue_generic_test<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
              (i_flags,i_output,i_rand,i_element_count,&local_68);
    if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    local_a0 = 1;
    __l_03._M_len = 1;
    __l_03._M_array = &local_a0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_80,__l_03,&local_a1);
    detail::
    single_queue_generic_test<density::heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>>
              (i_flags,i_output,i_rand,i_element_count,&local_80);
    local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void heter_queue_generic_tests(
      QueueTesterFlags i_flags,
      std::ostream &   i_output,
      EasyRandom &     i_rand,
      size_t           i_element_count)
    {
        using namespace density;

        if (i_flags && QueueTesterFlags::eUseTestAllocators)
        {
            detail::single_queue_generic_test<
              heter_queue<runtime_type<>, UnmovableFastTestAllocator<>>>(
              i_flags, i_output, i_rand, i_element_count, {1});

            detail::single_queue_generic_test<heter_queue<TestRuntimeTime<>, DeepTestAllocator<>>>(
              i_flags, i_output, i_rand, i_element_count, {1});

            detail::single_queue_generic_test<
              heter_queue<runtime_type<>, UnmovableFastTestAllocator<256>>>(
              i_flags, i_output, i_rand, i_element_count, {1});

            detail::single_queue_generic_test<
              heter_queue<TestRuntimeTime<>, DeepTestAllocator<256>>>(
              i_flags, i_output, i_rand, i_element_count, {1});
        }
        else
        {
            detail::single_queue_generic_test<heter_queue<>>(
              i_flags, i_output, i_rand, i_element_count, {1});
        }
    }